

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O2

void __thiscall
xmrig::HttpContext::HttpContext(HttpContext *this,int parser_type,IHttpListener *listener)

{
  uint64_t id;
  mapped_type *ppHVar1;
  http_parser *phVar2;
  uv_tcp_t *puVar3;
  undefined8 uVar4;
  uint64_t local_30;
  
  id = SEQUENCE;
  SEQUENCE = SEQUENCE + 1;
  HttpData::HttpData(&this->super_HttpData,id);
  this->_vptr_HttpContext = (_func_int **)&PTR__HttpContext_001bba38;
  this->m_wasHeaderValue = false;
  this->m_listener = listener;
  (this->m_lastHeaderField)._M_dataplus._M_p = (pointer)&(this->m_lastHeaderField).field_2;
  (this->m_lastHeaderField)._M_string_length = 0;
  (this->m_lastHeaderField).field_2._M_local_buf[0] = '\0';
  (this->m_lastHeaderValue)._M_dataplus._M_p = (pointer)&(this->m_lastHeaderValue).field_2;
  (this->m_lastHeaderValue)._M_string_length = 0;
  (this->m_lastHeaderValue).field_2._M_local_buf[0] = '\0';
  local_30 = (this->super_HttpData).m_id;
  ppHVar1 = std::
            map<unsigned_long,_xmrig::HttpContext_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
            ::operator[]((map<unsigned_long,_xmrig::HttpContext_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
                          *)storage,&local_30);
  *ppHVar1 = this;
  phVar2 = (http_parser *)operator_new(0x20);
  this->m_parser = phVar2;
  puVar3 = (uv_tcp_t *)operator_new(0xf8);
  this->m_tcp = puVar3;
  uVar4 = uv_default_loop();
  uv_tcp_init(uVar4,this->m_tcp);
  uv_tcp_nodelay(this->m_tcp,1);
  http_parser_init(this->m_parser,parser_type);
  this->m_tcp->data = this;
  this->m_parser->data = this;
  if (http_settings._56_8_ == 0) {
    attach((http_parser_settings *)http_settings);
  }
  return;
}

Assistant:

xmrig::HttpContext::HttpContext(int parser_type, IHttpListener *listener) :
    HttpData(SEQUENCE++),
    m_wasHeaderValue(false),
    m_listener(listener)
{
    storage[id()] = this;

    m_parser = new http_parser;
    m_tcp    = new uv_tcp_t;

    uv_tcp_init(uv_default_loop(), m_tcp);
    uv_tcp_nodelay(m_tcp, 1);

    http_parser_init(m_parser, static_cast<http_parser_type>(parser_type));

    m_parser->data = m_tcp->data = this;

    if (http_settings.on_message_complete == nullptr) {
        attach(&http_settings);
    }
}